

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell-interface.h
# Opt level: O2

void __thiscall
wasm::ShellExternalInterface::importGlobals
          (ShellExternalInterface *this,
          map<wasm::Name,_wasm::Literals,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
          *globals,Module *wasm)

{
  map<wasm::Name,_wasm::Literals,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
  *in_RCX;
  anon_class_16_2_d56293dd visitor;
  
  visitor.globals = in_RCX;
  visitor.this = (ShellExternalInterface *)globals;
  ModuleUtils::
  iterImportedGlobals<wasm::ShellExternalInterface::importGlobals(std::map<wasm::Name,wasm::Literals,std::less<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Literals>>>&,wasm::Module&)::_lambda(wasm::Global*)_1_>
            ((ModuleUtils *)wasm,(Module *)this,visitor);
  return;
}

Assistant:

void importGlobals(std::map<Name, Literals>& globals, Module& wasm) override {
    ModuleUtils::iterImportedGlobals(wasm, [&](Global* import) {
      auto inst = getImportInstance(import);
      auto* exportedGlobal = inst->wasm.getExportOrNull(import->base);
      if (!exportedGlobal || exportedGlobal->kind != ExternalKind::Global) {
        Fatal() << "importGlobals: unknown import: " << import->module.str
                << "." << import->name.str;
      }
      globals[import->name] = inst->globals[*exportedGlobal->getInternalName()];
    });
  }